

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.cpp
# Opt level: O3

void __thiscall Function::check_epilogue(Function *this,LinkedObjectFile *file)

{
  int iVar1;
  pointer pIVar2;
  pointer pBVar3;
  bool bVar4;
  Register RVar5;
  Register RVar6;
  Register RVar7;
  MatchParam<Register> dst_reg;
  MatchParam<Register> dst_reg_00;
  MatchParam<Register> src0;
  MatchParam<Register> src0_00;
  MatchParam<Register> src;
  MatchParam<Register> mem_reg;
  MatchParam<Register> dst_reg_01;
  MatchParam<Register> dst_reg_02;
  MatchParam<Register> dst;
  MatchParam<Register> dst_00;
  MatchParam<Register> dst_01;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  MatchParam<Register> src1;
  MatchParam<Register> src1_00;
  MatchParam<int> imm;
  MatchParam<Register> mem_reg_00;
  int iVar14;
  MatchParam<Register> mem_reg_01;
  MatchParam<Register> mem_reg_02;
  MatchParam<int> offset;
  MatchParam<int> offset_00;
  MatchParam<int> offset_01;
  MatchParam<int> offset_02;
  int iVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  
  if (((this->prologue).decoded != true) || (this->suspected_asm == true)) {
    puts("not decoded, or suspected asm, skipping epilogue");
    return;
  }
  lVar17 = ((long)(this->instructions).super__Vector_base<Instruction,_std::allocator<Instruction>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->instructions).super__Vector_base<Instruction,_std::allocator<Instruction>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x4ec4ec4ec4ec4ec5;
  uVar16 = (ulong)(int)lVar17;
  lVar18 = (lVar17 << 0x20) + -0x100000000;
  lVar17 = uVar16 * 0xd0;
  do {
    lVar11 = lVar17;
    uVar16 = uVar16 - 1;
    pIVar2 = (this->instructions).super__Vector_base<Instruction,_std::allocator<Instruction>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar8 = ((long)(this->instructions).
                   super__Vector_base<Instruction,_std::allocator<Instruction>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pIVar2 >> 4) * 0x4ec4ec4ec4ec4ec5;
    if (uVar8 < uVar16 || uVar8 - uVar16 == 0) goto LAB_00134b5f;
    bVar4 = is_nop((Instruction *)((long)pIVar2[-1].src + lVar11 + -8));
    lVar18 = lVar18 + -0x100000000;
    lVar17 = lVar11 + -0xd0;
  } while (bVar4);
  iVar13 = (int)uVar16;
  this->epilogue_end = iVar13;
  pIVar2 = (this->instructions).super__Vector_base<Instruction,_std::allocator<Instruction>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar8 = ((long)(this->instructions).super__Vector_base<Instruction,_std::allocator<Instruction>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)pIVar2 >> 4) * 0x4ec4ec4ec4ec4ec5
  ;
  if ((this->prologue).total_stack_usage == 0) {
    if (uVar8 < uVar16 || uVar8 - uVar16 == 0) goto LAB_00134b5f;
    RVar5 = make_gpr(SP);
    RVar6 = make_gpr(SP);
    RVar7 = make_gpr(R0);
    src0_00._2_2_ = 0;
    src0_00.value.id = RVar6.id;
    dst_00._2_2_ = 0;
    dst_00.value.id = RVar5.id;
    src1_00._2_2_ = 0;
    src1_00.value.id = RVar7.id;
    bVar4 = is_gpr_3((Instruction *)((long)pIVar2[-1].src + lVar11 + -8),
                     (MatchParam<InstructionKind>)0x3,dst_00,src0_00,src1_00);
    if (!bVar4) {
      __assert_fail("is_gpr_3(instructions.at(idx), InstructionKind::DADDU, make_gpr(Reg::SP), make_gpr(Reg::SP), make_gpr(Reg::R0))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/Function/Function.cpp"
                    ,0x166,"void Function::check_epilogue(const LinkedObjectFile &)");
    }
  }
  else {
    if (uVar8 < uVar16 || uVar8 - uVar16 == 0) goto LAB_00134b5f;
    RVar5 = make_gpr(SP);
    RVar6 = make_gpr(SP);
    RVar7 = make_gpr(R0);
    src0._2_2_ = 0;
    src0.value.id = RVar6.id;
    dst._2_2_ = 0;
    dst.value.id = RVar5.id;
    src1._2_2_ = 0;
    src1.value.id = RVar7.id;
    bVar4 = is_gpr_3((Instruction *)((long)pIVar2[-1].src + lVar11 + -8),
                     (MatchParam<InstructionKind>)0x3,dst,src0,src1);
    if (bVar4) {
      uVar16 = lVar18 >> 0x20;
      pIVar2 = (this->instructions).super__Vector_base<Instruction,_std::allocator<Instruction>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar8 = ((long)(this->instructions).
                     super__Vector_base<Instruction,_std::allocator<Instruction>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pIVar2 >> 4) * 0x4ec4ec4ec4ec4ec5;
      if (uVar8 < uVar16 || uVar8 - uVar16 == 0) goto LAB_00134b5f;
      bVar4 = is_jr_ra(pIVar2 + uVar16);
      if (!bVar4) {
        __assert_fail("is_jr_ra(instructions.at(idx))",
                      "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/Function/Function.cpp"
                      ,0x159,"void Function::check_epilogue(const LinkedObjectFile &)");
      }
      uVar16 = (ulong)(iVar13 - 2);
      puts("[Warning] Double Return Epilogue Hack!  This is probably an ASM function in disguise");
      std::__cxx11::string::append((char *)&this->warnings);
    }
    iVar13 = (int)uVar16;
    uVar16 = (ulong)iVar13;
    pIVar2 = (this->instructions).super__Vector_base<Instruction,_std::allocator<Instruction>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar8 = ((long)(this->instructions).
                   super__Vector_base<Instruction,_std::allocator<Instruction>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pIVar2 >> 4) * 0x4ec4ec4ec4ec4ec5;
    if (uVar8 < uVar16 || uVar8 - uVar16 == 0) goto LAB_00134b5f;
    RVar5 = make_gpr(SP);
    RVar6 = make_gpr(SP);
    imm._4_4_ = 0;
    imm.value = (this->prologue).total_stack_usage;
    src._2_2_ = 0;
    src.value.id = RVar6.id;
    dst_01._2_2_ = 0;
    dst_01.value.id = RVar5.id;
    bVar4 = is_gpr_2_imm_int(pIVar2 + uVar16,(MatchParam<InstructionKind>)0x4,dst_01,src,imm);
    if (!bVar4) {
      __assert_fail("is_gpr_2_imm_int(instructions.at(idx), InstructionKind::DADDIU, make_gpr(Reg::SP), make_gpr(Reg::SP), prologue.total_stack_usage)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/Function/Function.cpp"
                    ,0x161,"void Function::check_epilogue(const LinkedObjectFile &)");
    }
  }
  uVar8 = (ulong)(iVar13 + -1);
  pIVar2 = (this->instructions).super__Vector_base<Instruction,_std::allocator<Instruction>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar9 = ((long)(this->instructions).super__Vector_base<Instruction,_std::allocator<Instruction>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)pIVar2 >> 4) * 0x4ec4ec4ec4ec4ec5
  ;
  uVar16 = uVar8;
  if (uVar9 < uVar8 || uVar9 - uVar8 == 0) {
LAB_00134b5f:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar16);
  }
  bVar4 = is_jr_ra(pIVar2 + uVar8);
  if (!bVar4) {
    __assert_fail("is_jr_ra(instructions.at(idx))",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/Function/Function.cpp"
                  ,0x16b,"void Function::check_epilogue(const LinkedObjectFile &)");
  }
  iVar14 = 0;
  iVar12 = -1;
  iVar15 = 0;
  lVar17 = uVar8 * 0xd0;
  while( true ) {
    uVar8 = uVar8 - 1;
    iVar1 = (this->prologue).n_gpr_backup;
    if (iVar1 <= iVar15) break;
    uVar9 = (ulong)(iVar1 + iVar12);
    uVar16 = uVar9;
    if (((ulong)(DAT_001609c0 - (anonymous_namespace)::gpr_backups >> 1) <= uVar9) ||
       (pIVar2 = (this->instructions).super__Vector_base<Instruction,_std::allocator<Instruction>_>.
                 _M_impl.super__Vector_impl_data._M_start,
       uVar10 = ((long)(this->instructions).
                       super__Vector_base<Instruction,_std::allocator<Instruction>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pIVar2 >> 4) * 0x4ec4ec4ec4ec4ec5,
       uVar16 = uVar8, uVar10 < uVar8 || uVar10 - uVar8 == 0)) goto LAB_00134b5f;
    offset.value = (this->prologue).gpr_backup_offset + iVar14;
    offset._4_4_ = 0;
    dst_reg._2_2_ = 0;
    dst_reg.value.id = *(ushort *)((anonymous_namespace)::gpr_backups + uVar9 * 2);
    RVar5 = make_gpr(SP);
    mem_reg_00._2_2_ = 0;
    mem_reg_00.value.id = RVar5.id;
    bVar4 = is_no_ll_gpr_load((Instruction *)((long)pIVar2[-1].src + lVar17 + -8),
                              (MatchParam<int>)0x10,(MatchParam<bool>)0x1,dst_reg,offset,mem_reg_00)
    ;
    iVar14 = iVar14 + 0x10;
    iVar12 = iVar12 + -1;
    iVar15 = iVar15 + 1;
    lVar17 = lVar17 + -0xd0;
    if (!bVar4) {
      __assert_fail("is_no_ll_gpr_load(instructions.at(idx), 16, true, expected_reg, expected_offset, make_gpr(Reg::SP))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/Function/Function.cpp"
                    ,0x174,"void Function::check_epilogue(const LinkedObjectFile &)");
    }
  }
  iVar12 = (this->prologue).n_fpr_backup;
  if (0 < iVar12) {
    uVar8 = (ulong)((iVar13 + -2) - iVar15);
    lVar18 = uVar8 * 0xd0;
    iVar14 = 0;
    lVar17 = -1;
    iVar13 = 0;
    do {
      uVar9 = iVar12 + lVar17;
      uVar16 = uVar9;
      if (((ulong)(DAT_001609d8 - (anonymous_namespace)::fpr_backups >> 1) <= uVar9) ||
         (pIVar2 = (this->instructions).
                   super__Vector_base<Instruction,_std::allocator<Instruction>_>._M_impl.
                   super__Vector_impl_data._M_start,
         uVar10 = ((long)(this->instructions).
                         super__Vector_base<Instruction,_std::allocator<Instruction>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)pIVar2 >> 4) * 0x4ec4ec4ec4ec4ec5
         , uVar16 = uVar8, uVar10 < uVar8 || uVar10 - uVar8 == 0)) goto LAB_00134b5f;
      offset_00.value = (this->prologue).fpr_backup_offset + iVar14;
      offset_00._4_4_ = 0;
      dst_reg_00._2_2_ = 0;
      dst_reg_00.value.id = *(ushort *)((anonymous_namespace)::fpr_backups + uVar9 * 2);
      RVar5 = make_gpr(SP);
      mem_reg._2_2_ = 0;
      mem_reg.value.id = RVar5.id;
      bVar4 = is_no_ll_fpr_load((Instruction *)((long)pIVar2->src + lVar18 + -8),dst_reg_00,
                                offset_00,mem_reg);
      if (!bVar4) {
        __assert_fail("is_no_ll_fpr_load(instructions.at(idx), expected_reg, expected_offset, make_gpr(Reg::SP))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/Function/Function.cpp"
                      ,0x17e,"void Function::check_epilogue(const LinkedObjectFile &)");
      }
      iVar13 = iVar13 + 1;
      uVar8 = uVar8 - 1;
      iVar12 = (this->prologue).n_fpr_backup;
      lVar18 = lVar18 + -0xd0;
      iVar14 = iVar14 + 4;
      lVar17 = lVar17 + -1;
    } while (iVar13 < iVar12);
  }
  iVar13 = (int)uVar8;
  if ((this->prologue).fp_backed_up != false) {
    uVar16 = (ulong)iVar13;
    pIVar2 = (this->instructions).super__Vector_base<Instruction,_std::allocator<Instruction>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar8 = ((long)(this->instructions).
                   super__Vector_base<Instruction,_std::allocator<Instruction>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pIVar2 >> 4) * 0x4ec4ec4ec4ec4ec5;
    if (uVar8 < uVar16 || uVar8 - uVar16 == 0) goto LAB_00134b5f;
    RVar5 = make_gpr(FP);
    offset_01._4_4_ = 0;
    offset_01.value = (this->prologue).fp_backup_offset;
    RVar6 = make_gpr(SP);
    dst_reg_01._2_2_ = 0;
    dst_reg_01.value.id = RVar5.id;
    mem_reg_01._2_2_ = 0;
    mem_reg_01.value.id = RVar6.id;
    bVar4 = is_no_ll_gpr_load(pIVar2 + uVar16,(MatchParam<int>)0x8,(MatchParam<bool>)0x1,dst_reg_01,
                              offset_01,mem_reg_01);
    if (!bVar4) {
      __assert_fail("is_no_ll_gpr_load(instructions.at(idx), 8, true, make_gpr(Reg::FP), prologue.fp_backup_offset, make_gpr(Reg::SP))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/Function/Function.cpp"
                    ,0x185,"void Function::check_epilogue(const LinkedObjectFile &)");
    }
    iVar13 = iVar13 + -1;
  }
  if ((this->prologue).ra_backed_up == true) {
    uVar16 = (ulong)iVar13;
    pIVar2 = (this->instructions).super__Vector_base<Instruction,_std::allocator<Instruction>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar8 = ((long)(this->instructions).
                   super__Vector_base<Instruction,_std::allocator<Instruction>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pIVar2 >> 4) * 0x4ec4ec4ec4ec4ec5;
    if (uVar8 < uVar16 || uVar8 - uVar16 == 0) goto LAB_00134b5f;
    RVar5 = make_gpr(RA);
    offset_02._4_4_ = 0;
    offset_02.value = (this->prologue).ra_backup_offset;
    RVar6 = make_gpr(SP);
    dst_reg_02._2_2_ = 0;
    dst_reg_02.value.id = RVar5.id;
    mem_reg_02._2_2_ = 0;
    mem_reg_02.value.id = RVar6.id;
    bVar4 = is_no_ll_gpr_load(pIVar2 + uVar16,(MatchParam<int>)0x8,(MatchParam<bool>)0x1,dst_reg_02,
                              offset_02,mem_reg_02);
    if (!bVar4) {
      __assert_fail("is_no_ll_gpr_load(instructions.at(idx), 8, true, make_gpr(Reg::RA), prologue.ra_backup_offset, make_gpr(Reg::SP))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/Function/Function.cpp"
                    ,0x18c,"void Function::check_epilogue(const LinkedObjectFile &)");
    }
    iVar13 = iVar13 + -1;
  }
  pBVar3 = (this->basic_blocks).super__Vector_base<BasicBlock,_std::allocator<BasicBlock>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((this->basic_blocks).super__Vector_base<BasicBlock,_std::allocator<BasicBlock>_>._M_impl.
      super__Vector_impl_data._M_start == pBVar3) {
    __assert_fail("!basic_blocks.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/Function/Function.cpp"
                  ,400,"void Function::check_epilogue(const LinkedObjectFile &)");
  }
  iVar13 = iVar13 + 1;
  if (iVar13 < pBVar3[-1].start_word) {
    __assert_fail("idx + 1 >= basic_blocks.back().start_word",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/Function/Function.cpp"
                  ,0x191,"void Function::check_epilogue(const LinkedObjectFile &)");
  }
  pBVar3[-1].end_word = iVar13;
  (this->prologue).epilogue_ok = true;
  this->epilogue_start = iVar13;
  return;
}

Assistant:

void Function::check_epilogue(const LinkedObjectFile& file) {
  (void)file;
  if (!prologue.decoded || suspected_asm) {
    printf("not decoded, or suspected asm, skipping epilogue\n");
    return;
  }

  // start at the end and move up.
  int idx = int(instructions.size()) - 1;

  // seek past alignment nops
  while (is_nop(instructions.at(idx))) {
    idx--;
  }

  epilogue_end = idx;
  // stack restore
  if (prologue.total_stack_usage) {
    // hack - sometimes an asm function has a compiler inserted jr ra/daddu sp sp r0 that follows
    // the "true" return.  We really should have this function flagged as asm, but for now, we can
    // simply skip over the compiler-generated jr ra/daddu sp sp r0.
    if (is_gpr_3(instructions.at(idx), InstructionKind::DADDU, make_gpr(Reg::SP), make_gpr(Reg::SP),
                 make_gpr(Reg::R0))) {
      idx--;
      assert(is_jr_ra(instructions.at(idx)));
      idx--;
      printf(
          "[Warning] Double Return Epilogue Hack!  This is probably an ASM function in disguise\n");
      warnings += "Double Return Epilogue - this is probably an ASM function\n";
    }
    // delay slot should be daddiu sp, sp, offset
    assert(is_gpr_2_imm_int(instructions.at(idx), InstructionKind::DADDIU, make_gpr(Reg::SP),
                            make_gpr(Reg::SP), prologue.total_stack_usage));
    idx--;
  } else {
    // delay slot is always daddu sp, sp, r0...
    assert(is_gpr_3(instructions.at(idx), InstructionKind::DADDU, make_gpr(Reg::SP),
                    make_gpr(Reg::SP), make_gpr(Reg::R0)));
    idx--;
  }

  // jr ra
  assert(is_jr_ra(instructions.at(idx)));
  idx--;

  // restore gprs
  for (int i = 0; i < prologue.n_gpr_backup; i++) {
    int gpr_idx = prologue.n_gpr_backup - (1 + i);
    const auto& expected_reg = gpr_backups.at(gpr_idx);
    auto expected_offset = prologue.gpr_backup_offset + 16 * i;
    assert(is_no_ll_gpr_load(instructions.at(idx), 16, true, expected_reg, expected_offset,
                             make_gpr(Reg::SP)));
    idx--;
  }

  // restore fprs
  for (int i = 0; i < prologue.n_fpr_backup; i++) {
    int fpr_idx = prologue.n_fpr_backup - (1 + i);
    const auto& expected_reg = fpr_backups.at(fpr_idx);
    auto expected_offset = prologue.fpr_backup_offset + 4 * i;
    assert(
        is_no_ll_fpr_load(instructions.at(idx), expected_reg, expected_offset, make_gpr(Reg::SP)));
    idx--;
  }

  // restore fp
  if (prologue.fp_backed_up) {
    assert(is_no_ll_gpr_load(instructions.at(idx), 8, true, make_gpr(Reg::FP),
                             prologue.fp_backup_offset, make_gpr(Reg::SP)));
    idx--;
  }

  // restore ra
  if (prologue.ra_backed_up) {
    assert(is_no_ll_gpr_load(instructions.at(idx), 8, true, make_gpr(Reg::RA),
                             prologue.ra_backup_offset, make_gpr(Reg::SP)));
    idx--;
  }

  assert(!basic_blocks.empty());
  assert(idx + 1 >= basic_blocks.back().start_word);
  basic_blocks.back().end_word = idx + 1;
  prologue.epilogue_ok = true;
  epilogue_start = idx + 1;
}